

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_cpy_m_d_aarch64(void *vd,void *vn,void *vg,uint64_t mm,uint32_t desc)

{
  intptr_t iVar1;
  uint64_t local_68;
  uint64_t nn;
  uint8_t *pg;
  uint64_t *n;
  uint64_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  uint64_t mm_local;
  void *vg_local;
  void *vn_local;
  void *vd_local;
  
  iVar1 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < iVar1 / 8; opr_sz = opr_sz + 1) {
    local_68 = *(uint64_t *)((long)vn + opr_sz * 8);
    if ((*(byte *)((long)vg + opr_sz) & 1) != 0) {
      local_68 = mm;
    }
    *(uint64_t *)((long)vd + opr_sz * 8) = local_68;
  }
  return;
}

Assistant:

void HELPER(sve_cpy_m_d)(void *vd, void *vn, void *vg,
                         uint64_t mm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 8;
    uint64_t *d = vd, *n = vn;
    uint8_t *pg = vg;

    for (i = 0; i < opr_sz; i += 1) {
        uint64_t nn = n[i];
        d[i] = (pg[H1(i)] & 1 ? mm : nn);
    }
}